

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

int __thiscall vm_rcdesc::init(vm_rcdesc *this,EVP_PKEY_CTX *ctx)

{
  uchar *puVar1;
  int in_ECX;
  long lVar2;
  long in_RDX;
  vm_val_t *in_R8;
  int in_R9D;
  
  this->name = (char *)ctx;
  vm_val_t::set_nil(&this->self);
  this->method_idx = 0;
  lVar2 = in_RDX + (long)in_ECX * 0x38;
  *(undefined8 *)&this->bifptr = *(undefined8 *)(lVar2 + 0x18);
  (this->bifptr).val = *(anon_union_8_8_cb74652f_for_val *)(lVar2 + 0x20);
  this->argp = in_R8;
  this->argc = in_R9D;
  puVar1 = CVmRun::get_last_pc();
  this->caller_addr = puVar1;
  return (int)this;
}

Assistant:

void vm_rcdesc::init(VMG_ const char *name,
                     const vm_bif_desc *funcset, int idx,
                     vm_val_t *argp, int argc)
{
    this->name = name;
    this->self.set_nil();
    this->method_idx = 0;
    this->bifptr = funcset[idx].bifptr;
    this->argp = argp;
    this->argc = argc;
    this->caller_addr = G_interpreter->get_last_pc();
}